

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngine.cpp
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_359b51::BuildEngineImpl::resolveCycle(BuildEngineImpl *this,KeyType *buildKey)

{
  bool bVar1;
  undefined1 local_48 [8];
  vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_> cycleList;
  lock_guard<std::mutex> guard2;
  lock_guard<std::mutex> guard1;
  KeyType *buildKey_local;
  BuildEngineImpl *this_local;
  
  std::lock_guard<std::mutex>::lock_guard(&guard2,&this->taskInfosMutex);
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)
             &cycleList.
              super__Vector_base<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,&this->finishedTaskInfosMutex);
  findCycle((vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_> *)local_48,this,
            buildKey);
  bVar1 = std::vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>::empty
                    ((vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_> *)
                     local_48);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    bVar1 = breakCycle(this,(vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_> *
                            )local_48);
    if (!bVar1) {
      (*this->delegate->_vptr_BuildEngineDelegate[6])(this->delegate,local_48);
    }
    std::vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>::~vector
              ((vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_> *)local_48);
    std::lock_guard<std::mutex>::~lock_guard
              ((lock_guard<std::mutex> *)
               &cycleList.
                super__Vector_base<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    std::lock_guard<std::mutex>::~lock_guard(&guard2);
    return bVar1;
  }
  __assert_fail("!cycleList.empty()",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Core/BuildEngine.cpp"
                ,0x442,"bool (anonymous namespace)::BuildEngineImpl::resolveCycle(const KeyType &)")
  ;
}

Assistant:

bool resolveCycle(const KeyType& buildKey) {
    // Take all available locks, to ensure we dump a consistent state.
    std::lock_guard<std::mutex> guard1(taskInfosMutex);
    std::lock_guard<std::mutex> guard2(finishedTaskInfosMutex);

    std::vector<Rule*> cycleList = findCycle(buildKey);
    assert(!cycleList.empty());

    if (breakCycle(cycleList))
      return true;

    delegate.cycleDetected(cycleList);
    return false;
  }